

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scrypt.cc
# Opt level: O1

int EVP_PBE_scrypt(char *password,size_t password_len,uint8_t *salt,size_t salt_len,uint64_t N,
                  uint64_t r,uint64_t p,size_t max_mem,uint8_t *out_key,size_t key_len)

{
  undefined1 auVar1 [16];
  int iVar2;
  ulong uVar3;
  uchar *out;
  EVP_MD *pEVar4;
  int iVar5;
  uint uVar6;
  long lVar7;
  
  if (((((p == 0 || r == 0) || (auVar1._8_8_ = 0, auVar1._0_8_ = r, N < 2)) ||
       (SUB168((ZEXT816(0) << 0x40 | ZEXT816(0x3fffffff)) / auVar1,0) < p)) ||
      ((0x100000000 < N ||
       (uVar3 = N - (N >> 1 & 0x5555555555555555),
       uVar3 = (uVar3 >> 2 & 0x3333333333333333) + (uVar3 & 0x3333333333333333),
       1 < (byte)(((uVar3 >> 4) + uVar3 & 0xf0f0f0f0f0f0f0f) * 0x101010101010101 >> 0x38))))) ||
     (N >> ((byte)(r << 4) & 0x3f) != 0 && r << 4 < 0x40)) {
    iVar2 = 0x85;
    iVar5 = 0xa1;
  }
  else {
    uVar3 = 0x4100000;
    if (max_mem != 0) {
      uVar3 = max_mem;
    }
    uVar3 = uVar3 / (r << 7);
    if ((p < uVar3) && (N <= uVar3 + ~p)) {
      out = (uchar *)OPENSSL_calloc((p * 2 + N * 2 + 2) * r,0x40);
      if (out == (uchar *)0x0) {
        return 0;
      }
      lVar7 = p * 2 * r * 0x40;
      pEVar4 = EVP_sha256();
      iVar5 = (int)lVar7;
      iVar2 = PKCS5_PBKDF2_HMAC(password,(int)password_len,salt,(int)salt_len,1,pEVar4,iVar5,out);
      if (iVar2 == 0) {
        uVar6 = 0;
      }
      else {
        if (p != 0) {
          memcpy(out + r * 0x80 + lVar7,out,r << 7);
        }
        pEVar4 = EVP_sha256();
        iVar2 = PKCS5_PBKDF2_HMAC(password,(int)password_len,out,iVar5,1,pEVar4,(int)key_len,out_key
                                 );
        uVar6 = (uint)(iVar2 != 0);
      }
      OPENSSL_free(out);
      return uVar6;
    }
    iVar2 = 0x84;
    iVar5 = 0xad;
  }
  ERR_put_error(6,0,iVar2,
                "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/evp/scrypt.cc"
                ,iVar5);
  return 0;
}

Assistant:

int EVP_PBE_scrypt(const char *password, size_t password_len,
                   const uint8_t *salt, size_t salt_len, uint64_t N, uint64_t r,
                   uint64_t p, size_t max_mem, uint8_t *out_key,
                   size_t key_len) {
  if (r == 0 || p == 0 || p > SCRYPT_PR_MAX / r ||
      // |N| must be a power of two.
      N < 2 || (N & (N - 1)) ||
      // We only support |N| <= 2^32 in |scryptROMix|.
      N > UINT64_C(1) << 32 ||
      // Check that |N| < 2^(128×r / 8).
      (16 * r <= 63 && N >= UINT64_C(1) << (16 * r))) {
    OPENSSL_PUT_ERROR(EVP, EVP_R_INVALID_PARAMETERS);
    return 0;
  }

  // Determine the amount of memory needed. B, T, and V are |p|, 1, and |N|
  // scrypt blocks, respectively. Each scrypt block is 2*|r| |block_t|s.
  if (max_mem == 0) {
    max_mem = SCRYPT_MAX_MEM;
  }

  size_t max_scrypt_blocks = max_mem / (2 * r * sizeof(block_t));
  if (max_scrypt_blocks < p + 1 || max_scrypt_blocks - p - 1 < N) {
    OPENSSL_PUT_ERROR(EVP, EVP_R_MEMORY_LIMIT_EXCEEDED);
    return 0;
  }

  // Allocate and divide up the scratch space. |max_mem| fits in a size_t, which
  // is no bigger than uint64_t, so none of these operations may overflow.
  static_assert(UINT64_MAX >= SIZE_MAX, "size_t exceeds uint64_t");
  size_t B_blocks = p * 2 * r;
  size_t B_bytes = B_blocks * sizeof(block_t);
  size_t T_blocks = 2 * r;
  size_t V_blocks = N * 2 * r;
  block_t *B = reinterpret_cast<block_t *>(
      OPENSSL_calloc(B_blocks + T_blocks + V_blocks, sizeof(block_t)));
  if (B == NULL) {
    return 0;
  }

  int ret = 0;
  block_t *T = B + B_blocks;
  block_t *V = T + T_blocks;

  // NOTE: PKCS5_PBKDF2_HMAC can only fail due to allocation failure
  // or |iterations| of 0 (we pass 1 here). This is consistent with
  // the documented failure conditions of EVP_PBE_scrypt.
  if (!PKCS5_PBKDF2_HMAC(password, password_len, salt, salt_len, 1,
                         EVP_sha256(), B_bytes, (uint8_t *)B)) {
    goto err;
  }

  for (uint64_t i = 0; i < p; i++) {
    scryptROMix(B + 2 * r * i, r, N, T, V);
  }

  if (!PKCS5_PBKDF2_HMAC(password, password_len, (const uint8_t *)B, B_bytes, 1,
                         EVP_sha256(), key_len, out_key)) {
    goto err;
  }

  ret = 1;

err:
  OPENSSL_free(B);
  return ret;
}